

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::AllocateMapValue
          (DynamicMapField *this,MapValueRef *map_val)

{
  int iVar1;
  CppType CVar2;
  undefined4 extraout_var;
  FieldDescriptor *this_00;
  Message *pMVar3;
  undefined4 extraout_var_00;
  undefined8 *puVar4;
  Reflection *this_01;
  allocator local_41;
  string local_40;
  
  iVar1 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  std::__cxx11::string::string((string *)&local_40,"value",&local_41);
  this_00 = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var,iVar1),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  CVar2 = FieldDescriptor::cpp_type(this_00);
  map_val->type_ = CVar2;
  CVar2 = FieldDescriptor::cpp_type(this_00);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
  case CPPTYPE_FLOAT:
  case CPPTYPE_ENUM:
    puVar4 = (undefined8 *)operator_new(4);
    *(undefined4 *)puVar4 = 0;
    break;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
  case CPPTYPE_DOUBLE:
    puVar4 = (undefined8 *)operator_new(8);
    *puVar4 = 0;
    break;
  case CPPTYPE_BOOL:
    puVar4 = (undefined8 *)operator_new(1);
    *(undefined1 *)puVar4 = 0;
    break;
  case CPPTYPE_STRING:
    puVar4 = (undefined8 *)operator_new(0x20);
    *puVar4 = puVar4 + 2;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    break;
  case CPPTYPE_MESSAGE:
    (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
    pMVar3 = Reflection::GetMessage(this_01,this->default_entry_,this_00,(MessageFactory *)0x0);
    iVar1 = (*(pMVar3->super_MessageLite)._vptr_MessageLite[3])(pMVar3);
    puVar4 = (undefined8 *)CONCAT44(extraout_var_00,iVar1);
    break;
  default:
    goto switchD_00263890_default;
  }
  map_val->data_ = puVar4;
switchD_00263890_default:
  return;
}

Assistant:

void DynamicMapField::AllocateMapValue(MapValueRef* map_val) {
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  map_val->SetType(val_des->cpp_type());
  // Allocate memory for the MapValueRef, and initialize to
  // default value.
  switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    TYPE* value = new TYPE();                \
    map_val->SetValue(value);                \
    break;                                   \
  }
    HANDLE_TYPE(INT32, int32);
    HANDLE_TYPE(INT64, int64);
    HANDLE_TYPE(UINT32, uint32);
    HANDLE_TYPE(UINT64, uint64);
    HANDLE_TYPE(DOUBLE, double);
    HANDLE_TYPE(FLOAT, float);
    HANDLE_TYPE(BOOL, bool);
    HANDLE_TYPE(STRING, std::string);
    HANDLE_TYPE(ENUM, int32);
#undef HANDLE_TYPE
    case FieldDescriptor::CPPTYPE_MESSAGE: {
      const Message& message =
          default_entry_->GetReflection()->GetMessage(*default_entry_, val_des);
      Message* value = message.New();
      map_val->SetValue(value);
      break;
    }
  }
}